

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

_Bool mi_bitmap_try_find_claim_field_across
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t idx,size_t count,size_t retries,
                mi_bitmap_index_t *bitmap_idx)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  bool bVar12;
  
  puVar1 = bitmap + idx;
  do {
    uVar4 = bitmap[idx];
    uVar3 = 0x40;
    if (uVar4 != 0) {
      uVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x3f;
    }
    if (uVar3 == 0) {
      return false;
    }
    if (count <= uVar3) {
      uVar4 = *puVar1;
      if (uVar4 == 0xffffffffffffffff) {
        return false;
      }
      uVar3 = 0xffffffffffffffff;
      if (count < 0x40) {
        if (count == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = ~(-1L << ((byte)count & 0x3f));
        }
      }
      uVar9 = 0x40 - count;
      uVar8 = 0;
      if (~uVar4 != 0) {
        for (; (~uVar4 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if (uVar9 < uVar8) {
        return uVar8 <= uVar9;
      }
      uVar3 = uVar3 << ((byte)uVar8 & 0x3f);
      while( true ) {
        uVar6 = uVar3 & uVar4;
        if (uVar6 == 0) {
          LOCK();
          uVar6 = *puVar1;
          bVar12 = uVar4 == uVar6;
          if (bVar12) {
            *puVar1 = uVar3 | uVar4;
            uVar6 = uVar4;
          }
          UNLOCK();
          bVar5 = false;
          if (bVar12) {
            *bitmap_idx = uVar8 + idx * 0x40;
            bVar5 = true;
          }
        }
        else {
          uVar2 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          lVar7 = 0x40 - ((uVar2 ^ 0x3f) + uVar8);
          if (count == 1) {
            lVar7 = 1;
          }
          uVar8 = uVar8 + lVar7;
          uVar3 = uVar3 << ((byte)lVar7 & 0x3f);
          bVar5 = false;
          uVar6 = uVar4;
        }
        if (bVar5) break;
        uVar4 = uVar6;
        if (uVar9 < uVar8) {
          return uVar8 <= uVar9;
        }
      }
      return true;
    }
    if (bitmap_fields - idx <= (count - uVar3) + 0x3f >> 6) {
      return false;
    }
    uVar8 = uVar3;
    puVar10 = puVar1;
    if (uVar3 < count) {
      do {
        uVar6 = count - uVar8;
        if (uVar8 + 0x40 <= count) {
          uVar6 = 0x40;
        }
        uVar9 = 0xffffffffffffffff;
        if (uVar6 < 0x40) {
          if (uVar6 == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = ~(-1L << ((byte)uVar6 & 0x3f));
          }
        }
        if ((uVar9 & puVar10[1]) != 0) {
          return false;
        }
        puVar10 = puVar10 + 1;
        uVar8 = uVar8 + uVar6;
      } while (uVar8 < count);
    }
    else {
      uVar9 = 0;
    }
    uVar8 = -(ulong)(uVar4 == 0) | ~(-1L << ((byte)uVar3 & 0x3f)) << (-(byte)uVar3 & 0x3f);
    uVar4 = *puVar1;
    do {
      puVar11 = puVar1;
      if ((uVar4 & uVar8) != 0) goto LAB_009481c2;
      LOCK();
      uVar6 = *puVar1;
      bVar12 = uVar4 == uVar6;
      if (bVar12) {
        *puVar1 = uVar4 | uVar8;
        uVar6 = uVar4;
      }
      UNLOCK();
      uVar4 = uVar6;
      puVar11 = bitmap + idx;
    } while (!bVar12);
    while (puVar11 = puVar11 + 1, puVar11 < puVar10) {
      LOCK();
      uVar4 = *puVar11;
      if (uVar4 == 0) {
        *puVar11 = 0xffffffffffffffff;
      }
      UNLOCK();
      if (uVar4 != 0) goto LAB_009481c2;
    }
    uVar4 = *puVar11;
    while ((uVar4 & uVar9) == 0) {
      LOCK();
      uVar6 = *puVar11;
      bVar12 = uVar4 == uVar6;
      if (bVar12) {
        *puVar11 = uVar4 | uVar9;
        uVar6 = uVar4;
      }
      UNLOCK();
      uVar4 = uVar6;
      if (bVar12) {
        *bitmap_idx = (0x40 - uVar3) + idx * 0x40;
        return true;
      }
    }
LAB_009481c2:
    while (puVar11 = puVar11 + -1, puVar1 < puVar11) {
      *puVar11 = 0;
    }
    if (puVar11 == puVar1) {
      uVar4 = *puVar11;
      do {
        LOCK();
        uVar3 = *puVar11;
        bVar12 = uVar4 == uVar3;
        if (bVar12) {
          *puVar11 = uVar4 & ~uVar8;
          uVar3 = uVar4;
        }
        UNLOCK();
        uVar4 = uVar3;
      } while (!bVar12);
    }
    if (2 < retries) {
      return false;
    }
    retries = retries + 1;
  } while( true );
}

Assistant:

static bool mi_bitmap_try_find_claim_field_across(mi_bitmap_t bitmap, size_t bitmap_fields, size_t idx, const size_t count, const size_t retries, mi_bitmap_index_t* bitmap_idx)
{
  mi_assert_internal(bitmap_idx != NULL);

  // check initial trailing zeros
  mi_bitmap_field_t* field = &bitmap[idx];
  size_t map = mi_atomic_load_relaxed(field);
  const size_t initial = mi_clz(map);  // count of initial zeros starting at idx
  mi_assert_internal(initial <= MI_BITMAP_FIELD_BITS);
  if (initial == 0)     return false;
  if (initial >= count) return _mi_bitmap_try_find_claim_field(bitmap, idx, count, bitmap_idx);    // no need to cross fields (this case won't happen for us)
  if (_mi_divide_up(count - initial, MI_BITMAP_FIELD_BITS) >= (bitmap_fields - idx)) return false; // not enough entries

  // scan ahead
  size_t found = initial;
  size_t mask = 0;     // mask bits for the final field
  while(found < count) {
    field++;
    map = mi_atomic_load_relaxed(field);
    const size_t mask_bits = (found + MI_BITMAP_FIELD_BITS <= count ? MI_BITMAP_FIELD_BITS : (count - found));
    mi_assert_internal(mask_bits > 0 && mask_bits <= MI_BITMAP_FIELD_BITS);
    mask = mi_bitmap_mask_(mask_bits, 0);
    if ((map & mask) != 0) return false;  // some part is already claimed
    found += mask_bits;
  }
  mi_assert_internal(field < &bitmap[bitmap_fields]);

  // we found a range of contiguous zeros up to the final field; mask contains mask in the final field
  // now try to claim the range atomically
  mi_bitmap_field_t* const final_field = field;
  const size_t final_mask = mask;
  mi_bitmap_field_t* const initial_field = &bitmap[idx];
  const size_t initial_idx = MI_BITMAP_FIELD_BITS - initial;
  const size_t initial_mask = mi_bitmap_mask_(initial, initial_idx);

  // initial field
  size_t newmap;
  field = initial_field;
  map = mi_atomic_load_relaxed(field);
  do {
    newmap = (map | initial_mask);
    if ((map & initial_mask) != 0) { goto rollback; };
  } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));

  // intermediate fields
  while (++field < final_field) {
    newmap = MI_BITMAP_FIELD_FULL;
    map = 0;
    if (!mi_atomic_cas_strong_acq_rel(field, &map, newmap)) { goto rollback; }
  }

  // final field
  mi_assert_internal(field == final_field);
  map = mi_atomic_load_relaxed(field);
  do {
    newmap = (map | final_mask);
    if ((map & final_mask) != 0) { goto rollback; }
  } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));

  // claimed!
  *bitmap_idx = mi_bitmap_index_create(idx, initial_idx);
  return true;

rollback:
  // roll back intermediate fields
  // (we just failed to claim `field` so decrement first)
  while (--field > initial_field) {
    newmap = 0;
    map = MI_BITMAP_FIELD_FULL;
    mi_assert_internal(mi_atomic_load_relaxed(field) == map);
    mi_atomic_store_release(field, newmap);
  }
  if (field == initial_field) {               // (if we failed on the initial field, `field + 1 == initial_field`)
    map = mi_atomic_load_relaxed(field);
    do {
      mi_assert_internal((map & initial_mask) == initial_mask);
      newmap = (map & ~initial_mask);
    } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));
  }
  mi_stat_counter_increase(_mi_stats_main.arena_rollback_count,1);
  // retry? (we make a recursive call instead of goto to be able to use const declarations)
  if (retries <= 2) {
    return mi_bitmap_try_find_claim_field_across(bitmap, bitmap_fields, idx, count, retries+1, bitmap_idx);
  }
  else {
    return false;
  }
}